

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O3

int64_t soul::heart::getClockRatioFromValue<soul::CodeLocation&>
                  (CodeLocation *errorLocation,Value *value)

{
  ulong uVar1;
  PackedData local_d0;
  CompileMessage local_b8;
  CompileMessage local_80;
  CompileMessage local_48;
  
  if ((1 < (value->type).primitiveType.type - int32) || ((value->type).category != primitive)) {
    CompileMessageHelpers::createMessage<>
              (&local_48,syntax,error,"Clock ratio must be an integer constant");
    CodeLocation::throwError(errorLocation,&local_48);
  }
  soul::Value::getData(&local_d0,value);
  uVar1 = soul::Value::PackedData::getAsInt64(&local_d0);
  if (uVar1 - 0x201 < 0xfffffffffffffe00) {
    CompileMessageHelpers::createMessage<>(&local_80,syntax,error,"Clock ratio out of range");
    CodeLocation::throwError(errorLocation,&local_80);
  }
  if ((uVar1 & uVar1 - 1) == 0) {
    return uVar1;
  }
  CompileMessageHelpers::createMessage<>(&local_b8,syntax,error,"Clock ratio must be a power of 2");
  CodeLocation::throwError(errorLocation,&local_b8);
}

Assistant:

static int64_t getClockRatioFromValue (Thrower&& errorLocation, const Value& value)
    {
        if (! value.getType().isPrimitiveInteger())
            errorLocation.throwError (Errors::ratioMustBeInteger());

        auto v = value.getAsInt64();

        if (v < 1 || v > 512)
            errorLocation.throwError (Errors::ratioOutOfRange());

        if (! choc::math::isPowerOf2 (v))
            errorLocation.throwError (Errors::ratioMustBePowerOf2());

        return v;
    }